

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int flow_set_available(FLOW_HANDLE flow,uint32_t available_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE available_amqp_value;
  FLOW_INSTANCE *flow_instance;
  int result;
  uint32_t available_value_local;
  FLOW_HANDLE flow_local;
  
  if (flow == (FLOW_HANDLE)0x0) {
    flow_instance._0_4_ = 0x1962;
  }
  else {
    item_value = amqpvalue_create_uint(available_value);
    if (item_value == (AMQP_VALUE)0x0) {
      flow_instance._0_4_ = 0x196a;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(flow->composite_value,7,item_value);
      if (iVar1 == 0) {
        flow_instance._0_4_ = 0;
      }
      else {
        flow_instance._0_4_ = 0x1970;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)flow_instance;
}

Assistant:

int flow_set_available(FLOW_HANDLE flow, uint32_t available_value)
{
    int result;

    if (flow == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)flow;
        AMQP_VALUE available_amqp_value = amqpvalue_create_uint(available_value);
        if (available_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(flow_instance->composite_value, 7, available_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(available_amqp_value);
        }
    }

    return result;
}